

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tools.cpp
# Opt level: O0

double Tools::NormalizeAngle(double a,int debug)

{
  ostream *this;
  void *this_00;
  int local_18;
  int n;
  int debug_local;
  double a_local;
  
  local_18 = 0;
  for (_n = a; 3.141592653589793 < _n; _n = _n - 6.283185307179586) {
    local_18 = local_18 + 1;
  }
  for (; _n < -3.141592653589793; _n = _n + 6.283185307179586) {
    local_18 = local_18 + 1;
  }
  if ((0 < local_18) && (debug != 0)) {
    this = std::operator<<((ostream *)&std::cout,"normalize operations: ");
    this_00 = (void *)std::ostream::operator<<(this,local_18);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  return _n;
}

Assistant:

double Tools::NormalizeAngle(double a, int debug) {
#if defined(NORM_ANGLE_LOOP)
    int n = 0;
    while (a > M_PI)  {a -= Tools::PI2; n++;}
    while (a < -M_PI) {a += Tools::PI2; n++;}
    if (n>0 && debug)
        std::cout << "normalize operations: " << n  << std::endl; 
    return a;
#elif defined(NORM_ANGLE_CEIL)
    return a - ceil((a-M_PI)/(Tools::PI2))*Tools::PI2;
#else
    return a;
#endif
}